

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

btVector3 operator*(btVector3 *v1,btVector3 *v2)

{
  btVector3 bVar1;
  
  bVar1.m_floats[0] = v1->m_floats[0] * v2->m_floats[0];
  bVar1.m_floats[1] =
       (float)*(undefined8 *)(v2->m_floats + 1) * (float)*(undefined8 *)(v1->m_floats + 1);
  bVar1.m_floats[2] =
       (float)((ulong)*(undefined8 *)(v2->m_floats + 1) >> 0x20) *
       (float)((ulong)*(undefined8 *)(v1->m_floats + 1) >> 0x20);
  bVar1.m_floats[3] = 0.0;
  return (btVector3)bVar1.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v1, const btVector3& v2)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	return btVector3(_mm_mul_ps(v1.mVec128, v2.mVec128));
#elif defined(BT_USE_NEON)
	return btVector3(vmulq_f32(v1.mVec128, v2.mVec128));
#else
	return btVector3(
			v1.m_floats[0] * v2.m_floats[0],
			v1.m_floats[1] * v2.m_floats[1],
			v1.m_floats[2] * v2.m_floats[2]);
#endif
}